

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
yy::parser::stack_symbol_type::stack_symbol_type(stack_symbol_type *this,stack_symbol_type *that)

{
  filename_type *pfVar1;
  counter_type cVar2;
  counter_type cVar3;
  counter_type cVar4;
  counter_type cVar5;
  long lVar6;
  ulong uVar7;
  value_type *this_00;
  
  (this->super_basic_symbol<yy::parser::by_state>).super_by_state.state =
       (that->super_basic_symbol<yy::parser::by_state>).super_by_state.state;
  (this->super_basic_symbol<yy::parser::by_state>).value.yytypeid_ = (type_info *)0x0;
  *(undefined8 *)&(this->super_basic_symbol<yy::parser::by_state>).value.field_0 = 0;
  *(undefined8 *)((long)&(this->super_basic_symbol<yy::parser::by_state>).value.field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->super_basic_symbol<yy::parser::by_state>).value.field_0 + 0x10) = 0;
  *(undefined8 *)((long)&(this->super_basic_symbol<yy::parser::by_state>).value.field_0 + 0x18) = 0;
  pfVar1 = (that->super_basic_symbol<yy::parser::by_state>).location.begin.filename;
  cVar4 = (that->super_basic_symbol<yy::parser::by_state>).location.begin.line;
  cVar5 = (that->super_basic_symbol<yy::parser::by_state>).location.begin.column;
  cVar2 = (that->super_basic_symbol<yy::parser::by_state>).location.end.line;
  cVar3 = (that->super_basic_symbol<yy::parser::by_state>).location.end.column;
  (this->super_basic_symbol<yy::parser::by_state>).location.end.filename =
       (that->super_basic_symbol<yy::parser::by_state>).location.end.filename;
  (this->super_basic_symbol<yy::parser::by_state>).location.end.line = cVar2;
  (this->super_basic_symbol<yy::parser::by_state>).location.end.column = cVar3;
  (this->super_basic_symbol<yy::parser::by_state>).location.begin.filename = pfVar1;
  (this->super_basic_symbol<yy::parser::by_state>).location.begin.line = cVar4;
  (this->super_basic_symbol<yy::parser::by_state>).location.begin.column = cVar5;
  lVar6 = (long)(that->super_basic_symbol<yy::parser::by_state>).super_by_state.state;
  if ((lVar6 != 0) && (uVar7 = (ulong)(byte)yystos_[lVar6], uVar7 < 0x2c)) {
    this_00 = &(this->super_basic_symbol<yy::parser::by_state>).value;
    if ((0xd61c0000000U >> (uVar7 & 0x3f) & 1) == 0) {
      if ((0x70880UL >> (uVar7 & 0x3f) & 1) == 0) {
        if (uVar7 == 0xe) {
          value_type::move<ReferenceType>
                    (this_00,&(that->super_basic_symbol<yy::parser::by_state>).value);
        }
      }
      else {
        value_type::move<std::__cxx11::string>
                  (this_00,&(that->super_basic_symbol<yy::parser::by_state>).value);
      }
    }
    else {
      value_type::move<unsigned_long>
                (this_00,&(that->super_basic_symbol<yy::parser::by_state>).value);
    }
  }
  (that->super_basic_symbol<yy::parser::by_state>).super_by_state.state = '\0';
  return;
}

Assistant:

parser::stack_symbol_type::stack_symbol_type (YY_RVREF (stack_symbol_type) that)
    : super_type (YY_MOVE (that.state), YY_MOVE (that.location))
  {
    switch (that.kind ())
    {
      case symbol_kind::S_REF_OPEN: // "reference opening"
        value.YY_MOVE_OR_COPY< ReferenceType > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_arguments: // arguments
      case symbol_kind::S_argument_list: // argument_list
      case symbol_kind::S_parenthesized_arguments: // parenthesized_arguments
      case symbol_kind::S_quoted_argument: // quoted_argument
      case symbol_kind::S_quoted_element_list: // quoted_element_list
      case symbol_kind::S_unquoted_argument: // unquoted_argument
      case symbol_kind::S_reference: // reference
      case symbol_kind::S_var_reference_list: // var_reference_list
        value.YY_MOVE_OR_COPY< std::size_t > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_IDENTIFIER: // "command name"
      case symbol_kind::S_BRACKET_ARGUMENT: // "bracket argument"
      case symbol_kind::S_REF_VAR_NAME: // "variable name"
      case symbol_kind::S_QUOTED_STR: // "quoted argument chars"
      case symbol_kind::S_UNQUOTED_STR: // "unquoted argument chars"
        value.YY_MOVE_OR_COPY< std::string > (YY_MOVE (that.value));
        break;

      default:
        break;
    }

#if 201103L <= YY_CPLUSPLUS
    // that is emptied.
    that.state = empty_state;
#endif
  }